

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O0

int VP8GetThreadMethod(WebPDecoderOptions *options,WebPHeaderStructure *headers,int width,int height
                      )

{
  int height_local;
  int width_local;
  WebPHeaderStructure *headers_local;
  WebPDecoderOptions *options_local;
  int local_4;
  
  if ((options == (WebPDecoderOptions *)0x0) || (options->use_threads == 0)) {
    local_4 = 0;
  }
  else if (width < 0x200) {
    local_4 = 0;
  }
  else {
    local_4 = 2;
  }
  return local_4;
}

Assistant:

int VP8GetThreadMethod(const WebPDecoderOptions* const options,
                       const WebPHeaderStructure* const headers,
                       int width, int height) {
  if (options == NULL || options->use_threads == 0) {
    return 0;
  }
  (void)headers;
  (void)width;
  (void)height;
  assert(headers == NULL || !headers->is_lossless);
#if defined(WEBP_USE_THREAD)
  if (width >= MIN_WIDTH_FOR_THREADS) return 2;
#endif
  return 0;
}